

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

bool __thiscall duckdb::DBConfig::CanAccessFile(DBConfig *this,string *input_path,FileType type)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  size_type sVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  string prefix;
  string path;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = true;
  if ((this->options).enable_external_access == false) {
    SanitizeAllowedPath(&local_90,this,input_path);
    cVar5 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->options).allowed_paths._M_h,&local_90);
    bVar3 = true;
    if (cVar5.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      if ((this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
      {
        bVar3 = false;
      }
      else {
        if (type == FILE_TYPE_DIR) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/","");
          bVar3 = StringUtil::EndsWith((string *)&local_90,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if (!bVar3) {
            ::std::__cxx11::string::append((char *)&local_90);
          }
        }
        p_Var11 = &(this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var6 = p_Var11;
        for (p_Var12 = (this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_parent; p_Var12 != (_Base_ptr)0x0;
            p_Var12 = (&p_Var12->_M_left)[uVar4 >> 0x1f]) {
          uVar4 = ::std::__cxx11::string::compare((string *)(p_Var12 + 1));
          if (-1 < (int)uVar4) {
            p_Var6 = p_Var12;
          }
        }
        if (p_Var6 != (this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_left) {
          p_Var6 = (_Base_ptr)::std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var6);
        }
        p_Var12 = (this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        if (p_Var12 != (_Base_ptr)0x0) {
          do {
            uVar4 = ::std::__cxx11::string::compare((string *)&local_90);
            if ((int)uVar4 < 0) {
              p_Var11 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[~uVar4 >> 0x1f];
          } while (p_Var12 != (_Base_ptr)0x0);
        }
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        if (p_Var6 == p_Var11) {
LAB_01656eed:
          bVar3 = false;
        }
        else {
          do {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_90._M_dataplus._M_p,
                       local_90._M_dataplus._M_p + local_90._M_string_length);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,*(long *)(p_Var6 + 1),
                       (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
            bVar3 = StringUtil::StartsWith(&local_70,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (bVar3) {
              ::std::__cxx11::string::_M_assign((string *)&local_b0);
              break;
            }
            p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
          } while (p_Var6 != p_Var11);
          if (local_b0._M_string_length == 0) {
            bVar3 = false;
          }
          else {
            bVar3 = true;
            if (local_b0._M_string_length < local_90._M_string_length) {
              lVar8 = 0;
              sVar7 = local_b0._M_string_length;
              do {
                lVar9 = 3;
                uVar10 = sVar7;
                do {
                  uVar1 = uVar10 + 1;
                  lVar9 = lVar9 + -1;
                  if (local_90._M_string_length <= uVar10) break;
                  pcVar2 = local_90._M_dataplus._M_p + uVar10;
                  uVar10 = uVar1;
                } while (*pcVar2 != '/');
                if (((lVar9 == 0) && (local_90._M_dataplus._M_p[sVar7] == '.')) &&
                   (local_90._M_dataplus._M_p[sVar7 + 1] == '.')) {
                  uVar10 = 0xffffffffffffffff;
                  if (lVar8 == 0) goto LAB_01656eed;
                }
                else {
                  uVar10 = (ulong)(lVar9 != 2);
                }
                lVar8 = lVar8 + uVar10;
                sVar7 = uVar1;
              } while (uVar1 < local_90._M_string_length);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

bool DBConfig::CanAccessFile(const string &input_path, FileType type) {
	if (options.enable_external_access) {
		// all external access is allowed
		return true;
	}
	string path = SanitizeAllowedPath(input_path);
	if (options.allowed_paths.count(path) > 0) {
		// path is explicitly allowed
		return true;
	}
	if (options.allowed_directories.empty()) {
		// no prefix directories specified
		return false;
	}
	if (type == FileType::FILE_TYPE_DIR) {
		// make sure directories end with a /
		if (!StringUtil::EndsWith(path, "/")) {
			path += "/";
		}
	}
	auto start_bound = options.allowed_directories.lower_bound(path);
	if (start_bound != options.allowed_directories.begin()) {
		--start_bound;
	}
	auto end_bound = options.allowed_directories.upper_bound(path);

	string prefix;
	for (auto it = start_bound; it != end_bound; ++it) {
		if (StringUtil::StartsWith(path, *it)) {
			prefix = *it;
			break;
		}
	}
	if (prefix.empty()) {
		// no common prefix found - path is not inside an allowed directory
		return false;
	}
	D_ASSERT(StringUtil::EndsWith(prefix, "/"));
	// path is inside an allowed directory - HOWEVER, we could still exit the allowed directory using ".."
	// we check if we ever exit the allowed directory using ".." by looking at the path fragments
	idx_t directory_level = 0;
	idx_t current_pos = prefix.size();
	for (; current_pos < path.size(); current_pos++) {
		idx_t dir_begin = current_pos;
		// find either the end of the path or the directory separator
		for (; path[current_pos] != '/' && current_pos < path.size(); current_pos++) {
		}
		idx_t path_length = current_pos - dir_begin;
		if (path_length == 2 && path[dir_begin] == '.' && path[dir_begin + 1] == '.') {
			// go up a directory
			if (directory_level == 0) {
				// we cannot go up past the prefix
				return false;
			}
			--directory_level;
		} else if (path_length > 0) {
			directory_level++;
		}
	}
	return true;
}